

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O1

Error asmjit::x86::FuncInternal::initFuncDetail
                (FuncDetail *func,FuncSignature *signature,uint32_t registerSize)

{
  byte *pbVar1;
  FuncValuePack *pack;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  uint32_t uVar8;
  FuncValue *pFVar9;
  int iVar10;
  int iVar11;
  uint32_t argIndex;
  int iVar12;
  uint uVar13;
  uint32_t uVar14;
  uint32_t regType;
  uint uVar15;
  uint32_t valueIndex;
  size_t sVar16;
  uint32_t valueIndex_1;
  ulong uVar17;
  uint local_6c;
  uint local_5c;
  
  bVar2 = (func->_callConv)._spillZoneSize;
  bVar3 = func->_argCount;
  if ((func->_rets)._values[0]._data != 0) {
    pack = &func->_rets;
    bVar4 = (func->_callConv)._arch;
    unpackValues(func,pack);
    iVar11 = 0x15000000;
    if ((bVar4 & 1) == 0) {
      iVar11 = 0xb000000;
    }
    iVar12 = 0x15000100;
    uVar17 = 0;
    do {
      if (uVar17 == 4) {
        iVar10 = 2;
        break;
      }
      pFVar9 = FuncValuePack::operator[](pack,uVar17);
      bVar5 = (byte)pFVar9->_data;
      uVar13 = (uint)bVar5;
      iVar10 = 1;
      switch(bVar5) {
      case 0x22:
      case 0x24:
      case 0x26:
        bVar6 = false;
        if (uVar17 < 2) {
          pFVar9 = FuncValuePack::operator[](pack,uVar17);
          uVar8 = (uint)""[uVar17] << 0x10 | 0x5000126;
LAB_00131c74:
          pFVar9->_data = uVar8;
          bVar6 = true;
          iVar10 = 0;
        }
        break;
      case 0x23:
      case 0x25:
      case 0x27:
        bVar6 = false;
        if (uVar17 < 2) {
          pFVar9 = FuncValuePack::operator[](pack,uVar17);
          uVar8 = (uint)""[uVar17] << 0x10 | 0x5000127;
          goto LAB_00131c74;
        }
        break;
      case 0x28:
      case 0x29:
        bVar6 = false;
        iVar10 = 1;
        if (uVar17 < 2) {
          pFVar9 = FuncValuePack::operator[](pack,uVar17);
          uVar8 = (uint)""[uVar17] * 0x10000 + uVar13 + 0x6000100;
          goto LAB_00131c74;
        }
        break;
      case 0x2a:
      case 0x2b:
        pFVar9 = FuncValuePack::operator[](pack,uVar17);
        iVar10 = iVar11 + iVar12 + uVar13;
        goto LAB_00131ceb;
      case 0x2c:
        pFVar9 = FuncValuePack::operator[](pack,uVar17);
        pFVar9->_data = uVar13 + iVar12;
        goto LAB_00131cfe;
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
switchD_00131bba_caseD_2d:
        pFVar9 = FuncValuePack::operator[](pack,uVar17);
        uVar15 = (0x5a < uVar13 | 0xc) << 0x18;
        if (uVar13 < 0x51) {
          uVar15 = 0xb000000;
        }
        iVar10 = (uVar15 | uVar13) + iVar12;
LAB_00131ceb:
        pFVar9->_data = iVar10 + 0xeb000000;
LAB_00131cfe:
        bVar6 = true;
        iVar10 = 0;
        break;
      case 0x31:
      case 0x32:
        uVar15 = (uint)uVar17;
        if ((bVar4 & 1) == 0) {
          uVar7 = 0xb000000;
          if ((func->_callConv)._strategy != '\0') {
            uVar15 = (uint)""[uVar17];
            uVar7 = 0x6000000;
          }
          if (uVar15 == 0xff) {
            bVar6 = false;
            iVar10 = 1;
            break;
          }
        }
        else {
          uVar7 = 0xf000000;
        }
        pFVar9 = FuncValuePack::operator[](pack,uVar17);
        pFVar9->_data = (uVar15 << 0x10 | uVar7) + uVar13 + 0x100;
        iVar10 = 0;
        bVar6 = true;
        break;
      default:
        if (uVar13 != 0) goto switchD_00131bba_caseD_2d;
        bVar6 = false;
        iVar10 = 2;
      }
      uVar17 = uVar17 + 1;
      iVar12 = iVar12 + 0x10000;
    } while (bVar6);
    if (iVar10 != 2) {
      return 3;
    }
  }
  local_6c = (uint)bVar2;
  bVar4 = (func->_callConv)._strategy;
  if (bVar4 - 1 < 2) {
    local_6c = (uint)bVar2;
    for (uVar17 = 0; uVar17 != bVar3; uVar17 = uVar17 + 1) {
      unpackValues(func,func->_args + uVar17);
      for (sVar16 = 0; sVar16 != 4; sVar16 = sVar16 + 1) {
        pFVar9 = FuncValuePack::operator[](func->_args + uVar17,sVar16);
        uVar13 = pFVar9->_data;
        if (uVar13 == 0) {
          iVar11 = 0x10;
        }
        else {
          uVar15 = uVar13 & 0xff;
          uVar8 = Type::sizeOf(uVar15);
          if (uVar15 - 0x20 < 10 || uVar15 - 0x31 < 2) {
            uVar14 = 0xff;
            if (uVar17 < 0x10) {
              uVar14 = (uint32_t)(func->_callConv)._passedOrder[0].id[uVar17];
            }
            if (uVar14 == 0xff) {
LAB_00131e2b:
              FuncValue::assignStackOffset(pFVar9,local_6c);
LAB_00131e39:
              local_6c = local_6c + 8;
            }
            else {
              regType = (uVar15 - 0x31 < 2) + 5;
              if (4 < uVar8) {
                regType = 6;
              }
              FuncValue::assignRegData(pFVar9,regType,uVar14);
              func->_usedRegs[0] = func->_usedRegs[0] | 1 << ((byte)uVar14 & 0x1f);
            }
          }
          else {
            uVar7 = uVar15 - 0x2a;
            iVar11 = 0;
            if (2 < uVar7 && 0x31 < uVar15 - 0x33) goto LAB_00131ef9;
            uVar8 = 0xff;
            if (uVar17 < 0x10) {
              uVar8 = (uint32_t)(func->_callConv)._passedOrder[0].id[uVar17 + 0x10];
            }
            if ((bVar4 != 2 && 2 < uVar7) || (uVar8 == 0xff)) {
              if (uVar7 < 3) goto LAB_00131e2b;
              uVar13 = (uint)(func->_callConv)._passedOrder[0].id[uVar17];
              if (uVar13 == 0xff) {
                FuncValue::assignStackOffset(pFVar9,local_6c);
              }
              else {
                FuncValue::assignRegData(pFVar9,6,uVar13);
              }
              pbVar1 = (byte *)((long)&pFVar9->_data + 1);
              *pbVar1 = *pbVar1 | 4;
              goto LAB_00131e39;
            }
            uVar14 = 0xd - ((uVar13 & 0xff) < 0x5b);
            if (uVar15 < 0x51) {
              uVar14 = 0xb;
            }
            FuncValue::assignRegData(pFVar9,uVar14,uVar8);
            func->_usedRegs[1] = func->_usedRegs[1] | 1 << ((byte)uVar8 & 0x1f);
          }
          iVar11 = 0x12;
        }
LAB_00131ef9:
        if ((iVar11 != 0x12) && (iVar11 != 0)) break;
      }
    }
  }
  else if (bVar4 == 0) {
    local_5c = 0;
    uVar13 = 0;
    local_6c = (uint)bVar2;
    for (uVar17 = 0; uVar17 != bVar3; uVar17 = uVar17 + 1) {
      unpackValues(func,func->_args + uVar17);
      for (sVar16 = 0; sVar16 != 4; sVar16 = sVar16 + 1) {
        pFVar9 = FuncValuePack::operator[](func->_args + uVar17,sVar16);
        if (pFVar9->_data == 0) {
          iVar11 = 10;
        }
        else {
          uVar15 = pFVar9->_data & 0xff;
          if (uVar15 - 0x20 < 10) {
            uVar8 = 0xff;
            if (uVar13 < 0x10) {
              uVar8 = (uint32_t)(func->_callConv)._passedOrder[0].id[uVar13];
            }
            if (uVar8 == 0xff) {
              uVar8 = Type::sizeOf(uVar15);
              if (uVar8 <= registerSize) {
                uVar8 = registerSize;
              }
LAB_001320a4:
              FuncValue::assignStackOffset(pFVar9,local_6c);
              local_6c = local_6c + uVar8;
            }
            else {
              FuncValue::assignRegData(pFVar9,6 - (uVar15 < 0x28),uVar8);
              func->_usedRegs[0] = func->_usedRegs[0] | 1 << ((byte)uVar8 & 0x1f);
              uVar13 = uVar13 + 1;
            }
          }
          else {
            iVar11 = 0;
            if (2 < uVar15 - 0x2a && 0x31 < uVar15 - 0x33) goto LAB_001320f5;
            uVar8 = 0xff;
            if (local_5c < 0x10) {
              uVar8 = (uint32_t)(func->_callConv)._passedOrder[0].id[(ulong)local_5c + 0x10];
            }
            if (uVar15 - 0x2a < 3) {
              if (((func->_callConv)._flags & 4) == 0) {
                uVar8 = 0xff;
              }
            }
            else if ((signature->_vaIndex != 0xff) && (((func->_callConv)._flags & 8) != 0)) {
              uVar8 = 0xff;
            }
            if (uVar8 == 0xff) {
              uVar8 = Type::sizeOf(uVar15);
              goto LAB_001320a4;
            }
            uVar14 = 0xd - (uVar15 < 0x5b);
            pFVar9->_data = uVar15;
            if (uVar15 < 0x51) {
              uVar14 = 0xb;
            }
            FuncValue::assignRegData(pFVar9,uVar14,uVar8);
            func->_usedRegs[1] = func->_usedRegs[1] | 1 << ((byte)uVar8 & 0x1f);
            local_5c = local_5c + 1;
          }
          iVar11 = 0xc;
        }
LAB_001320f5:
        if ((iVar11 != 0xc) && (iVar11 != 0)) break;
      }
    }
  }
  func->_argStackSize = local_6c;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature, uint32_t registerSize) noexcept {
  const CallConv& cc = func.callConv();
  uint32_t arch = cc.arch();
  uint32_t stackOffset = cc._spillZoneSize;
  uint32_t argCount = func.argCount();

  // Up to two return values can be returned in GP registers.
  static const uint8_t gpReturnIndexes[4] = {
    uint8_t(Gp::kIdAx),
    uint8_t(Gp::kIdDx),
    uint8_t(BaseReg::kIdBad),
    uint8_t(BaseReg::kIdBad)
  };

  if (func.hasRet()) {
    unpackValues(func, func._rets);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      uint32_t typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (!typeId)
        break;

      switch (typeId) {
        case Type::kIdI64:
        case Type::kIdU64: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(Reg::kTypeGpq, gpReturnIndexes[valueIndex], typeId);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case Type::kIdI8:
        case Type::kIdI16:
        case Type::kIdI32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(Reg::kTypeGpd, gpReturnIndexes[valueIndex], Type::kIdI32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case Type::kIdU8:
        case Type::kIdU16:
        case Type::kIdU32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(Reg::kTypeGpd, gpReturnIndexes[valueIndex], Type::kIdU32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case Type::kIdF32:
        case Type::kIdF64: {
          uint32_t regType = Environment::is32Bit(arch) ? Reg::kTypeSt : Reg::kTypeXmm;
          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }

        case Type::kIdF80: {
          // 80-bit floats are always returned by FP0.
          func._rets[valueIndex].initReg(Reg::kTypeSt, valueIndex, typeId);
          break;
        }

        case Type::kIdMmx32:
        case Type::kIdMmx64: {
          // MM registers are returned through XMM (SystemV) or GPQ (Win64).
          uint32_t regType = Reg::kTypeMm;
          uint32_t regIndex = valueIndex;
          if (Environment::is64Bit(arch)) {
            regType = cc.strategy() == CallConv::kStrategyDefault ? Reg::kTypeXmm : Reg::kTypeGpq;
            regIndex = cc.strategy() == CallConv::kStrategyDefault ? valueIndex : gpReturnIndexes[valueIndex];

            if (regIndex == BaseReg::kIdBad)
              return DebugUtils::errored(kErrorInvalidState);
          }

          func._rets[valueIndex].initReg(regType, regIndex, typeId);
          break;
        }

        default: {
          func._rets[valueIndex].initReg(vecTypeIdToRegType(typeId), valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConv::kStrategyDefault: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          uint32_t typeId = arg.typeId();

          if (Type::isInt(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (gpzPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupGp].id[gpzPos];

            if (regId != BaseReg::kIdBad) {
              uint32_t regType = (typeId <= Type::kIdU32) ? Reg::kTypeGpd : Reg::kTypeGpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(Reg::kGroupGp, Support::bitMask(regId));
              gpzPos++;
            }
            else {
              uint32_t size = Support::max<uint32_t>(Type::sizeOf(typeId), registerSize);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }

          if (Type::isFloat(typeId) || Type::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (vecPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupVec].id[vecPos];

            if (Type::isFloat(typeId)) {
              // If this is a float, but `kFlagPassFloatsByVec` is false, we have
              // to use stack instead. This should be only used by 32-bit calling
              // conventions.
              if (!cc.hasFlag(CallConv::kFlagPassFloatsByVec))
                regId = BaseReg::kIdBad;
            }
            else {
              // Pass vector registers via stack if this is a variable arguments
              // function. This should be only used by 32-bit calling conventions.
              if (signature.hasVarArgs() && cc.hasFlag(CallConv::kFlagPassVecByStackIfVA))
                regId = BaseReg::kIdBad;
            }

            if (regId != BaseReg::kIdBad) {
              arg.initTypeId(typeId);
              arg.assignRegData(vecTypeIdToRegType(typeId), regId);
              func.addUsedRegs(Reg::kGroupVec, Support::bitMask(regId));
              vecPos++;
            }
            else {
              uint32_t size = Type::sizeOf(typeId);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }
        }
      }
      break;
    }

    case CallConv::kStrategyX64Windows:
    case CallConv::kStrategyX64VectorCall: {
      // Both X64 and VectorCall behave similarly - arguments are indexed
      // from left to right. The position of the argument determines in
      // which register the argument is allocated, so it's either GP or
      // one of XMM/YMM/ZMM registers.
      //
      //       [       X64       ] [VecCall]
      // Index: #0   #1   #2   #3   #4   #5
      //
      // GP   : RCX  RDX  R8   R9
      // VEC  : XMM0 XMM1 XMM2 XMM3 XMM4 XMM5
      //
      // For example function `f(int a, double b, int c, double d)` will be:
      //
      //        (a)  (b)  (c)  (d)
      //        RCX  XMM1 R8   XMM3
      //
      // Unused vector registers are used by HVA.
      bool isVectorCall = (cc.strategy() == CallConv::kStrategyX64VectorCall);

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          uint32_t typeId = arg.typeId();
          uint32_t size = Type::sizeOf(typeId);

          if (Type::isInt(typeId) || Type::isMmx(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupGp].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              uint32_t regType = (size <= 4 && !Type::isMmx(typeId)) ? Reg::kTypeGpd : Reg::kTypeGpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(Reg::kGroupGp, Support::bitMask(regId));
            }
            else {
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += 8;
            }
            continue;
          }

          if (Type::isFloat(typeId) || Type::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupVec].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              // X64-ABI doesn't allow vector types (XMM|YMM|ZMM) to be passed
              // via registers, however, VectorCall was designed for that purpose.
              if (Type::isFloat(typeId) || isVectorCall) {
                uint32_t regType = vecTypeIdToRegType(typeId);
                arg.assignRegData(regType, regId);
                func.addUsedRegs(Reg::kGroupVec, Support::bitMask(regId));
                continue;
              }
            }

            // Passed via stack if the argument is float/double or indirectly.
            // The trap is - if the argument is passed indirectly, the address
            // can be passed via register, if the argument's index has GP one.
            if (Type::isFloat(typeId)) {
              arg.assignStackOffset(int32_t(stackOffset));
            }
            else {
              uint32_t gpRegId = cc._passedOrder[Reg::kGroupGp].id[argIndex];
              if (gpRegId != BaseReg::kIdBad)
                arg.assignRegData(Reg::kTypeGpq, gpRegId);
              else
                arg.assignStackOffset(int32_t(stackOffset));
              arg.addFlags(FuncValue::kFlagIsIndirect);
            }

            // Always 8 bytes (float/double/pointer).
            stackOffset += 8;
            continue;
          }
        }
      }
      break;
    }
  }

  func._argStackSize = stackOffset;
  return kErrorOk;
}